

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Property * __thiscall
soul::AST::Annotation::findProperty<char[7]>(Annotation *this,char (*name) [7])

{
  Property *pPVar1;
  UnqualifiedName *pUVar2;
  bool bVar3;
  size_t sVar4;
  Property *p;
  Property *pPVar5;
  string_view other;
  
  pPVar5 = (this->properties).
           super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->properties).
           super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pPVar5 == pPVar1) {
      return (Property *)0x0;
    }
    pUVar2 = (pPVar5->name).object;
    sVar4 = strlen(*name);
    other._M_str = *name;
    other._M_len = sVar4;
    bVar3 = Identifier::operator==(&pUVar2->identifier,other);
    if (bVar3) break;
    pPVar5 = pPVar5 + 1;
  }
  return pPVar5;
}

Assistant:

const Property* findProperty (const StringType& name) const
        {
            for (auto& p : properties)
                if (p.name->identifier == name)
                    return std::addressof (p);

            return {};
        }